

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

int __thiscall Handle::cfunc(Handle *this)

{
  ulong uVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  uVar1 = (this->
          super_TaggedPointer<IntType<0>,_IntType<1>,_IntType<2>,_IntType<3>,_IntType<4>,_IntType<5>,_IntType<6>,_IntType<7>,_IntType<8>,_IntType<9>,_IntType<10>,_IntType<11>,_IntType<12>,_IntType<13>,_IntType<14>_>
          ).bits;
  sVar2 = (short)(uVar1 >> 0x30);
  uVar3 = (uint)(uVar1 >> 0x20);
  if (uVar1 >> 0x33 == 0) {
    if (uVar1 >> 0x32 == 0) {
      iVar4 = 0;
      if (uVar1 >> 0x31 != 0) {
        iVar4 = (sVar2 == 3) + 1;
      }
      return iVar4;
    }
    iVar5 = (sVar2 == 5) + 3;
    iVar4 = (sVar2 != 6) + 5;
    bVar6 = uVar3 >> 0x11 < 3;
  }
  else if (uVar3 >> 0x12 < 3) {
    iVar5 = (sVar2 == 9) + 7;
    iVar4 = (sVar2 != 10) + 9;
    bVar6 = uVar3 >> 0x11 < 5;
  }
  else {
    iVar5 = (sVar2 == 0xd) + 0xb;
    iVar4 = (sVar2 != 0xe) + 0xd;
    bVar6 = uVar3 >> 0x11 < 7;
  }
  if (bVar6) {
    iVar4 = iVar5;
  }
  return iVar4;
}

Assistant:

PBRT_CPU_GPU
    uint16_t Tag() const { return uint16_t((bits & tagMask) >> tagShift); }